

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_pss.cc
# Opt level: O0

int rsa_md_to_mgf1(X509_ALGOR **palg,EVP_MD *mgf1md)

{
  long lVar1;
  long lVar2;
  int iVar3;
  ASN1_STRING *pAVar4;
  X509_ALGOR *pXVar5;
  ASN1_OBJECT *aobj;
  ASN1_OCTET_STRING *local_30;
  ASN1_STRING *stmp;
  X509_ALGOR *algtmp;
  EVP_MD *mgf1md_local;
  X509_ALGOR **palg_local;
  
  algtmp = (X509_ALGOR *)mgf1md;
  mgf1md_local = (EVP_MD *)palg;
  iVar3 = is_allowed_pss_md(mgf1md);
  if (iVar3 == 0) {
    __assert_fail("is_allowed_pss_md(mgf1md)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/rsa_pss.cc"
                  ,0x62,"int rsa_md_to_mgf1(X509_ALGOR **, const EVP_MD *)");
  }
  stmp = (ASN1_STRING *)0x0;
  local_30 = (ASN1_STRING *)0x0;
  iVar3 = rsa_md_to_algor((X509_ALGOR **)&stmp,(EVP_MD *)algtmp);
  if ((iVar3 != 0) &&
     (pAVar4 = ASN1_item_pack(stmp,(ASN1_ITEM *)&X509_ALGOR_it,&local_30),
     pAVar4 != (ASN1_STRING *)0x0)) {
    pXVar5 = X509_ALGOR_new();
    *(X509_ALGOR **)mgf1md_local = pXVar5;
    lVar1._0_4_ = mgf1md_local->type;
    lVar1._4_4_ = mgf1md_local->md_size;
    if (lVar1 != 0) {
      pXVar5 = *(X509_ALGOR **)mgf1md_local;
      aobj = OBJ_nid2obj(0x38f);
      iVar3 = X509_ALGOR_set0(pXVar5,aobj,0x10,local_30);
      if (iVar3 != 0) {
        local_30 = (ASN1_STRING *)0x0;
      }
    }
  }
  ASN1_STRING_free(local_30);
  X509_ALGOR_free((X509_ALGOR *)stmp);
  lVar2._0_4_ = mgf1md_local->type;
  lVar2._4_4_ = mgf1md_local->md_size;
  palg_local._4_4_ = (uint)(lVar2 != 0);
  return palg_local._4_4_;
}

Assistant:

static int rsa_md_to_mgf1(X509_ALGOR **palg, const EVP_MD *mgf1md) {
  // SHA-1 should be omitted (DEFAULT), but we do not allow SHA-1.
  assert(is_allowed_pss_md(mgf1md));
  X509_ALGOR *algtmp = NULL;
  ASN1_STRING *stmp = NULL;
  // need to embed algorithm ID inside another
  if (!rsa_md_to_algor(&algtmp, mgf1md) ||
      !ASN1_item_pack(algtmp, ASN1_ITEM_rptr(X509_ALGOR), &stmp)) {
    goto err;
  }
  *palg = X509_ALGOR_new();
  if (!*palg) {
    goto err;
  }
  if (!X509_ALGOR_set0(*palg, OBJ_nid2obj(NID_mgf1), V_ASN1_SEQUENCE, stmp)) {
    goto err;
  }
  stmp = NULL;

err:
  ASN1_STRING_free(stmp);
  X509_ALGOR_free(algtmp);
  if (*palg) {
    return 1;
  }

  return 0;
}